

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_all.hpp
# Opt level: O0

tuple<char_&,_char_&>
burst::detail::
by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::iterator_range<std::_List_iterator<char>>&,boost::iterator_range<std::_List_iterator<char>>&>>
          (_Tuple_impl<1UL,_char_&> param_1,front_t *param_2,
          tuple<boost::iterator_range<std::_List_iterator<char>_>_&,_boost::iterator_range<std::_List_iterator<char>_>_&>
          *param_3)

{
  iterator_range<std::_List_iterator<char>_> *piVar1;
  char *__a1;
  char *__a2;
  _Head_base<0UL,_char_&,_false> extraout_RDX;
  tuple<char_&,_char_&> tVar2;
  tuple<boost::iterator_range<std::_List_iterator<char>_>_&,_boost::iterator_range<std::_List_iterator<char>_>_&>
  *t_local;
  front_t *f_local;
  
  piVar1 = std::
           get<0ul,boost::iterator_range<std::_List_iterator<char>>&,boost::iterator_range<std::_List_iterator<char>>&>
                     (param_3);
  __a1 = front_t::operator()(param_2,piVar1);
  piVar1 = std::
           get<1ul,boost::iterator_range<std::_List_iterator<char>>&,boost::iterator_range<std::_List_iterator<char>>&>
                     (param_3);
  __a2 = front_t::operator()(param_2,piVar1);
  std::tuple<char_&,_char_&>::tuple<true,_true>
            ((tuple<char_&,_char_&> *)param_1.super__Head_base<1UL,_char_&,_false>._M_head_impl,__a1
             ,__a2);
  tVar2.super__Tuple_impl<0UL,_char_&,_char_&>.super__Head_base<0UL,_char_&,_false>._M_head_impl =
       extraout_RDX._M_head_impl;
  tVar2.super__Tuple_impl<0UL,_char_&,_char_&>.super__Tuple_impl<1UL,_char_&>.
  super__Head_base<1UL,_char_&,_false>._M_head_impl =
       param_1.super__Head_base<1UL,_char_&,_false>._M_head_impl;
  return (tuple<char_&,_char_&>)tVar2.super__Tuple_impl<0UL,_char_&,_char_&>;
}

Assistant:

constexpr decltype(auto)
            by_all_impl (std::index_sequence<Indices...>, UnaryFunction & f, Tuple && t)
        {
            return
                std::tuple
                <
                    invoke_result_t
                    <
                        UnaryFunction &, std::tuple_element_t<Indices, std::decay_t<Tuple>>
                    >...
                >
                (
                    f(std::get<Indices>(std::forward<Tuple>(t)))...
                );
        }